

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void init_all_wedge_masks(void)

{
  byte bVar1;
  byte bVar2;
  wedge_masks_type *papuVar3;
  long lVar4;
  uint8_t *puVar5;
  uint uVar6;
  int iVar7;
  uint8_t (*pauVar8) [4096];
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  uint8_t (*pauVar13) [4096];
  ulong uVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  long lVar17;
  uint uVar18;
  size_t __n;
  int *piVar19;
  uint8_t (*paauVar20) [6] [4096];
  ulong uVar21;
  uint8_t (*__s) [1024];
  int bh;
  int bw;
  char local_78;
  size_t local_68;
  
  uVar12 = 0xfffffffffffffffe;
  uVar21 = 0x40;
  puVar11 = wedge_mask_obl[0][3] + 0x40;
  lVar4 = 0;
  paauVar20 = wedge_mask_obl;
  __n = 0x10;
  do {
    if ((long)__n < 0) {
      memcpy((uint8_t (*) [4096])(puVar11 + -0x40),"" + -__n,__n + 0x40);
      memset(puVar11 + __n,0x40,-__n);
      local_68 = __n - 1;
      puVar5 = wedge_mask_obl[0][3] + lVar4 * 0x40 + 0x40;
      uVar14 = lVar4 * 0x40 | 0x40;
LAB_003a62bd:
      memcpy(puVar5,"" + -__n + 1,__n + 0x3f);
      memset(puVar5 + __n + 0x3f,0x40,-__n + 1);
    }
    else {
      memcpy(puVar11 + (__n - 0x40),"",0x40 - __n);
      memset((uint8_t (*) [4096])(puVar11 + -0x40),0,__n);
      uVar14 = uVar21;
      if (__n == 0) {
        local_68 = 0xffffffffffffffff;
        puVar5 = puVar11;
        goto LAB_003a62bd;
      }
      local_68 = __n - 1;
      memcpy(puVar11 + (__n - 1),"",0x41 - __n);
      memset(puVar11,0,local_68);
    }
    puVar11[-0x2010] = '@';
    puVar11[-0x200f] = '@';
    puVar11[-0x200e] = '@';
    puVar11[-0x200d] = '@';
    puVar11[-0x200c] = '@';
    puVar11[-0x200b] = '@';
    puVar11[-0x200a] = '@';
    puVar11[-0x2009] = '@';
    puVar11[-0x2008] = '@';
    puVar11[-0x2007] = '@';
    puVar11[-0x2006] = '@';
    puVar11[-0x2005] = '@';
    puVar11[-0x2004] = '@';
    puVar11[-0x2003] = '@';
    puVar11[-0x2002] = '@';
    puVar11[-0x2001] = '@';
    puVar11[-0x2020] = '+';
    puVar11[-0x201f] = '9';
    puVar11[-0x201e] = '>';
    puVar11[-0x201d] = '@';
    puVar11[-0x201c] = '@';
    puVar11[-0x201b] = '@';
    puVar11[-0x201a] = '@';
    puVar11[-0x2019] = '@';
    puVar11[-0x2018] = '@';
    puVar11[-0x2017] = '@';
    puVar11[-0x2016] = '@';
    puVar11[-0x2015] = '@';
    puVar11[-0x2014] = '@';
    puVar11[-0x2013] = '@';
    puVar11[-0x2012] = '@';
    puVar11[-0x2011] = '@';
    puVar11[-0x2030] = '\0';
    puVar11[-0x202f] = '\0';
    puVar11[-0x202e] = '\0';
    puVar11[-0x202d] = '\0';
    puVar11[-0x202c] = '\0';
    puVar11[-0x202b] = '\0';
    puVar11[-0x202a] = '\0';
    puVar11[-0x2029] = '\0';
    puVar11[-0x2028] = '\0';
    puVar11[-0x2027] = '\0';
    puVar11[-0x2026] = '\0';
    puVar11[-0x2025] = '\0';
    puVar11[-0x2024] = '\0';
    puVar11[-0x2023] = '\x02';
    puVar11[-0x2022] = '\a';
    puVar11[-0x2021] = '\x15';
    puVar11[-0x2040] = '\0';
    puVar11[-0x203f] = '\0';
    puVar11[-0x203e] = '\0';
    puVar11[-0x203d] = '\0';
    puVar11[-0x203c] = '\0';
    puVar11[-0x203b] = '\0';
    puVar11[-0x203a] = '\0';
    puVar11[-0x2039] = '\0';
    puVar11[-0x2038] = '\0';
    puVar11[-0x2037] = '\0';
    puVar11[-0x2036] = '\0';
    puVar11[-0x2035] = '\0';
    puVar11[-0x2034] = '\0';
    puVar11[-0x2033] = '\0';
    puVar11[-0x2032] = '\0';
    puVar11[-0x2031] = '\0';
    puVar5 = wedge_mask_obl[0][1] + uVar14;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = wedge_mask_obl[0][1] + uVar14 + 8;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = wedge_mask_obl[0][1] + uVar14 + 0x10;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = wedge_mask_obl[0][1] + uVar14 + 0x18;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\x02';
    puVar5[6] = '\a';
    puVar5[7] = '\x15';
    builtin_memcpy(wedge_mask_obl[0][1] + uVar14 + 0x20,"+9>@@@@@",8);
    builtin_memcpy(wedge_mask_obl[0][1] + uVar14 + 0x28,"@@@@@@@@",8);
    builtin_memcpy(wedge_mask_obl[0][1] + uVar14 + 0x30,"@@@@@@@@",8);
    builtin_memcpy(wedge_mask_obl[0][1] + uVar14 + 0x38,"@@@@@@@@",8);
    lVar4 = lVar4 + 2;
    uVar12 = uVar12 + 2;
    uVar21 = uVar21 + 0x80;
    puVar11 = puVar11 + 0x80;
    __n = local_68;
    if (0x3d < uVar12) {
      puVar11 = wedge_mask_obl[0][4] + 0x3f;
      puVar5 = wedge_mask_obl[0][5] + 0xfc0;
      pauVar8 = wedge_mask_obl[1] + 3;
      lVar4 = 0;
      do {
        lVar17 = 0;
        pauVar13 = pauVar8;
        puVar15 = puVar5;
        puVar16 = puVar11;
        do {
          uVar10 = pauVar13[-6][0];
          *(uint8_t *)((long)paauVar20 + lVar17 + 0x2000) = uVar10;
          uVar9 = '@' - uVar10;
          *puVar15 = uVar9;
          *puVar16 = uVar9;
          *(uint8_t *)((long)paauVar20 + lVar17 + 0x8000) = uVar9;
          (*pauVar13)[0] = uVar9;
          puVar15[0x6000] = uVar10;
          puVar16[0x6000] = uVar10;
          uVar10 = pauVar13[-8][0];
          *(uint8_t *)((long)paauVar20 + lVar17) = uVar10;
          uVar10 = '@' - uVar10;
          *(uint8_t *)((long)paauVar20 + lVar17 + 0x6000) = uVar10;
          pauVar13[-2][0] = uVar10;
          lVar17 = lVar17 + 0x40;
          puVar16 = puVar16 + -1;
          puVar15 = puVar15 + -0x40;
          pauVar13 = (uint8_t (*) [4096])(*pauVar13 + 1);
        } while (lVar17 != 0x1000);
        lVar4 = lVar4 + 1;
        puVar11 = puVar11 + 0x40;
        puVar5 = puVar5 + 1;
        paauVar20 = (uint8_t (*) [6] [4096])((long)paauVar20 + 1);
        pauVar8 = (uint8_t (*) [4096])(*pauVar8 + 0x40);
      } while (lVar4 != 0x40);
      lVar4 = 0;
      memset(wedge_masks,0,0x1600);
      puVar11 = wedge_mask_buf;
      do {
        uVar18 = av1_wedge_params_lookup[lVar4].wedge_types;
        if (((ulong)uVar18 != 0) && (0 < (int)uVar18)) {
          bVar1 = block_size_wide[lVar4];
          bVar2 = block_size_high[lVar4];
          puVar5 = av1_wedge_params_lookup[lVar4].signflip;
          uVar6 = (uint)bVar1;
          piVar19 = &(av1_wedge_params_lookup[lVar4].codebook)->y_offset;
          uVar12 = 0;
          do {
            (*aom_convolve_copy)
                      ((uint8_t *)
                       ((long)-((int)(piVar19[-1] * uVar6) >> 3) +
                        (long)(int)(0x800 - (*piVar19 * (uint)bVar2 * 8 & 0xffffffc0)) +
                        (ulong)((wedge_code_type *)(piVar19 + -2))->direction * 0x1000 +
                        (ulong)((uint)puVar5[uVar12] * 0x6000) + 0x5eaea0),0x40,puVar11,(ulong)bVar1
                       ,uVar6,(int)bVar2);
            papuVar3 = av1_wedge_params_lookup[lVar4].masks;
            (*papuVar3)[uVar12] = puVar11;
            puVar11 = puVar11 + (uint)bVar2 * (uint)bVar1;
            (*aom_convolve_copy)
                      ((uint8_t *)
                       ((long)-((int)(piVar19[-1] * uVar6) >> 3) +
                        (long)(int)(0x800 - (*piVar19 * (uint)bVar2 * 8 & 0xffffffc0)) +
                        (ulong)((wedge_code_type *)(piVar19 + -2))->direction * 0x1000 +
                        (ulong)((puVar5[uVar12] ^ 1) * 0x6000) + 0x5eaea0),0x40,puVar11,(ulong)bVar1
                       ,uVar6,(int)bVar2);
            papuVar3[1][uVar12] = puVar11;
            puVar11 = puVar11 + (uint)bVar2 * (uint)bVar1;
            uVar12 = uVar12 + 1;
            piVar19 = piVar19 + 3;
          } while (uVar18 != uVar12);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x16);
      lVar4 = 0;
      do {
        local_68._0_4_ = (uint)lVar4 & 0xff;
        lVar17 = 0;
        do {
          if ((((uint)(0x10f400L >> ((byte)lVar17 & 0x3f)) |
               (uint)(0x20f800L >> ((byte)lVar17 & 0x3f))) & 1) == 0) {
            bVar1 = block_size_wide[lVar17];
            uVar12 = (ulong)bVar1;
            __s = smooth_interintra_mask_buf[lVar4] + lVar17;
            bVar2 = " \x10\x10\x10\b\b\b\x04\x04\x04\x02\x02\x02\x01\x01\x01\b\b\x04\x04\x02\x02"
                    [lVar17];
            local_78 = (char)lVar4;
            uVar18 = (uint)block_size_high[lVar17];
            if (local_78 == '\x01') {
              uVar21 = (ulong)(uVar18 + (uVar18 == 0));
              puVar11 = 
              "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              ;
              do {
                memset(__s,(uint)*puVar11,uVar12);
                __s = (uint8_t (*) [1024])(*__s + uVar12);
                puVar11 = puVar11 + bVar2;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
            }
            else if ((uint)local_68 == 2) {
              iVar7 = 0;
              do {
                puVar11 = 
                "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                ;
                uVar21 = 0;
                do {
                  (*__s)[uVar21] = *puVar11;
                  uVar21 = uVar21 + 1;
                  puVar11 = puVar11 + bVar2;
                } while ((uint)bVar1 + (uint)(bVar1 == 0) != uVar21);
                __s = (uint8_t (*) [1024])(*__s + uVar12);
                iVar7 = iVar7 + 1;
              } while (iVar7 != uVar18 + (uVar18 == 0));
            }
            else if ((uint)local_68 == 3) {
              uVar6 = 0;
              do {
                uVar21 = 0;
                do {
                  uVar14 = uVar21 & 0xffffffff;
                  if (uVar6 < (uint)uVar21) {
                    uVar14 = (ulong)uVar6;
                  }
                  (*__s)[uVar21] =
                       "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                       [uVar14 * bVar2];
                  uVar21 = uVar21 + 1;
                } while ((uint)bVar1 + (uint)(bVar1 == 0) != uVar21);
                __s = (uint8_t (*) [1024])(*__s + uVar12);
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar18 + (uVar18 == 0));
            }
            else {
              memset(smooth_interintra_mask_buf[lVar4] + lVar17,0x20,
                     (uVar18 + (block_size_high[lVar17] == 0) & 0xff) * uVar12);
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x16);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      return;
    }
  } while( true );
}

Assistant:

static void init_all_wedge_masks(void) {
  init_wedge_master_masks();
  init_wedge_masks();
  init_smooth_interintra_masks();
}